

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintTupleTo<std::tuple<long(*)(int_const*,int_const*,long,long*,int),long(*)(int_const*,int_const*,long,long*,int),aom_bit_depth>,2ul>
               (undefined8 param_1,ostream *param_2)

{
  ostream *in_stack_ffffffffffffffd8;
  _func_long_int_ptr_int_ptr_long_long_ptr_int **in_stack_ffffffffffffffe0;
  
  PrintTupleTo<std::tuple<long(*)(int_const*,int_const*,long,long*,int),long(*)(int_const*,int_const*,long,long*,int),aom_bit_depth>,1ul>
            (param_1,param_2);
  std::operator<<(param_2,", ");
  std::
  get<1ul,long(*)(int_const*,int_const*,long,long*,int),long(*)(int_const*,int_const*,long,long*,int),aom_bit_depth>
            ((tuple<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_aom_bit_depth>
              *)0xb21fc8);
  UniversalPrinter<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int)>::Print
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}